

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rang.hpp
# Opt level: O2

bool rang::rang_implementation::isTerminal(streambuf *osbuf)

{
  undefined1 uVar1;
  int iVar2;
  
  if (*(streambuf **)(std::__cxx11::string::append + *(long *)(std::cout + -0x18)) == osbuf) {
    uVar1 = isTerminal::cout_term;
    if ((isTerminal(std::streambuf_const*)::cout_term == '\0') &&
       (iVar2 = __cxa_guard_acquire(&isTerminal(std::streambuf_const*)::cout_term),
       uVar1 = isTerminal::cout_term, iVar2 != 0)) {
      iVar2 = fileno(_stdout);
      iVar2 = isatty(iVar2);
      isTerminal::cout_term = iVar2 != 0;
      __cxa_guard_release(&isTerminal(std::streambuf_const*)::cout_term);
      uVar1 = isTerminal::cout_term;
    }
  }
  else if ((*(streambuf **)(*(long *)(std::cerr + -0x18) + 0x114358) == osbuf) ||
          (*(streambuf **)(std::__cxx11::string::append + *(long *)(std::clog + -0x18)) == osbuf)) {
    uVar1 = isTerminal::cerr_term;
    if ((isTerminal(std::streambuf_const*)::cerr_term == '\0') &&
       (iVar2 = __cxa_guard_acquire(&isTerminal(std::streambuf_const*)::cerr_term),
       uVar1 = isTerminal::cerr_term, iVar2 != 0)) {
      iVar2 = fileno(_stderr);
      iVar2 = isatty(iVar2);
      isTerminal::cerr_term = iVar2 != 0;
      __cxa_guard_release(&isTerminal(std::streambuf_const*)::cerr_term);
      uVar1 = isTerminal::cerr_term;
    }
  }
  else {
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

inline bool isTerminal(const std::streambuf *osbuf) noexcept
    {
        using std::cerr;
        using std::clog;
        using std::cout;
#if defined(OS_LINUX) || defined(OS_MAC)
        if (osbuf == cout.rdbuf()) {
            static const bool cout_term = isatty(fileno(stdout)) != 0;
            return cout_term;
        } else if (osbuf == cerr.rdbuf() || osbuf == clog.rdbuf()) {
            static const bool cerr_term = isatty(fileno(stderr)) != 0;
            return cerr_term;
        }
#elif defined(OS_WIN)
        if (osbuf == cout.rdbuf()) {
            static const bool cout_term
              = (_isatty(_fileno(stdout)) || isMsysPty(_fileno(stdout)));
            return cout_term;
        } else if (osbuf == cerr.rdbuf() || osbuf == clog.rdbuf()) {
            static const bool cerr_term
              = (_isatty(_fileno(stderr)) || isMsysPty(_fileno(stderr)));
            return cerr_term;
        }
#endif
        return false;
    }